

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O3

int mp_read_int32(char **data,int32_t *ret)

{
  char cVar1;
  char *pcVar2;
  uint *puVar3;
  uint uVar4;
  
  pcVar2 = *data;
  cVar1 = *pcVar2;
  puVar3 = (uint *)(pcVar2 + 1);
  switch(cVar1) {
  case -0x34:
    uVar4 = (uint)(byte)pcVar2[1];
    goto LAB_001047ee;
  case -0x33:
    puVar3 = (uint *)(pcVar2 + 3);
    uVar4 = (uint)(ushort)(*(ushort *)(pcVar2 + 1) << 8 | *(ushort *)(pcVar2 + 1) >> 8);
    break;
  case -0x32:
    uVar4 = *puVar3;
    uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    if ((int)uVar4 < 0) {
      return -1;
    }
    goto LAB_001047c9;
  default:
    if (cVar1 < -0x20) {
      return -1;
    }
    uVar4 = (uint)cVar1;
    break;
  case -0x30:
    uVar4 = (uint)pcVar2[1];
LAB_001047ee:
    puVar3 = (uint *)(pcVar2 + 2);
    break;
  case -0x2f:
    puVar3 = (uint *)(pcVar2 + 3);
    uVar4 = (uint)(short)(*(ushort *)(pcVar2 + 1) << 8 | *(ushort *)(pcVar2 + 1) >> 8);
    break;
  case -0x2e:
    uVar4 = *(uint *)(pcVar2 + 1);
    uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
LAB_001047c9:
    puVar3 = (uint *)(pcVar2 + 5);
  }
  *ret = uVar4;
  *data = (char *)puVar3;
  return 0;
}

Assistant:

MP_IMPL int
mp_read_int32(const char **data, int32_t *ret)
{
	uint32_t uval;
	const char *p = *data;
	uint8_t c = mp_load_u8(&p);
	switch (c) {
	case 0xd0:
		*ret = (int8_t) mp_load_u8(&p);
		break;
	case 0xd1:
		*ret = (int16_t) mp_load_u16(&p);
		break;
	case 0xd2:
		*ret = (int32_t) mp_load_u32(&p);
		break;
	case 0xcc:
		*ret = mp_load_u8(&p);
		break;
	case 0xcd:
		*ret = mp_load_u16(&p);
		break;
	case 0xce:
		uval = mp_load_u32(&p);
		if (mp_unlikely(uval > INT32_MAX))
			return -1;
		*ret = uval;
		break;
	default:
		if (mp_unlikely(c < 0xe0 && c > 0x7f))
			return -1;
		*ret = (int8_t) c;
		break;
	}
	*data = p;
	return 0;
}